

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

Expr * __thiscall
SQCompilation::CheckerVisitor::maybeEval
          (CheckerVisitor *this,Expr *e,int32_t *evalId,
          unordered_set<const_SQCompilation::Expr_*,_std::hash<const_SQCompilation::Expr_*>,_std::equal_to<const_SQCompilation::Expr_*>,_std::allocator<const_SQCompilation::Expr_*>_>
          *visited,bool allow_external)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  ValueRef *pVVar3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  Expr *local_30;
  
  uVar1 = (visited->_M_h)._M_bucket_count;
  uVar4 = (ulong)e % uVar1;
  p_Var5 = (visited->_M_h)._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var5->_M_nxt, p_Var6 = p_Var5, (Expr *)p_Var5->_M_nxt[1]._M_nxt != e)) {
    while (p_Var5 = p_Var2, p_Var2 = p_Var5->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, (Expr *)p_Var2[1]._M_nxt == e)) goto LAB_00158944;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_00158944:
  if ((p_Var6 == (__node_base_ptr)0x0) || (p_Var6->_M_nxt == (_Hash_node_base *)0x0)) {
    local_30 = e;
    std::
    _Hashtable<SQCompilation::Expr_const*,SQCompilation::Expr_const*,std::allocator<SQCompilation::Expr_const*>,std::__detail::_Identity,std::equal_to<SQCompilation::Expr_const*>,std::hash<SQCompilation::Expr_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_M_emplace<SQCompilation::Expr_const*&>
              ((_Hashtable<SQCompilation::Expr_const*,SQCompilation::Expr_const*,std::allocator<SQCompilation::Expr_const*>,std::__detail::_Identity,std::equal_to<SQCompilation::Expr_const*>,std::hash<SQCompilation::Expr_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)visited,&local_30);
    local_30 = deparen(local_30);
    pVVar3 = findValueForExpr(this,local_30);
    e = local_30;
    if (((pVVar3 != (ValueRef *)0x0) &&
        (*evalId = pVVar3->evalIndex, pVVar3->state - VRS_EXPRESSION < 2)) &&
       ((allow_external ||
        ((pVVar3->expression == (Expr *)0x0 ||
         ((pVVar3->expression->super_Node)._op != TO_EXTERNAL_VALUE)))))) {
      e = maybeEval(this,pVVar3->expression,evalId,visited,allow_external);
    }
  }
  return e;
}

Assistant:

const Expr *CheckerVisitor::maybeEval(const Expr *e, int32_t &evalId, std::unordered_set<const Expr *> &visited, bool allow_external) {

  if (visited.find(e) != visited.end())
    return e;

  visited.emplace(e);

  e = deparen(e);
  const ValueRef *v = findValueForExpr(e);

  if (!v) {
    return e;
  }

  evalId = v->evalIndex;
  if (v->hasValue()) {
    if (!allow_external && v->expression && v->expression->op() == TO_EXTERNAL_VALUE)
      return e;
    return maybeEval(v->expression, evalId, visited, allow_external);
  }
  else {
    return e;
  }
}